

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpthreaddelegate.cpp
# Opt level: O0

void __thiscall QHttpThreadDelegate::encryptedSlot(QHttpThreadDelegate *this)

{
  QHttpThreadDelegate *in_RDI;
  long in_FS_OFFSET;
  QSslConfiguration *in_stack_ffffffffffffffd8;
  QHttpNetworkReply *this_00;
  
  this_00 = *(QHttpNetworkReply **)(in_FS_OFFSET + 0x28);
  if (in_RDI->httpReply != (QHttpNetworkReply *)0x0) {
    QHttpNetworkReply::sslConfiguration(this_00);
    sslConfigurationChanged(in_RDI,in_stack_ffffffffffffffd8);
    QSslConfiguration::~QSslConfiguration((QSslConfiguration *)0x310650);
    encrypted((QHttpThreadDelegate *)0x31065a);
  }
  if (*(QHttpNetworkReply **)(in_FS_OFFSET + 0x28) != this_00) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QHttpThreadDelegate::encryptedSlot()
{
    if (!httpReply)
        return;

    emit sslConfigurationChanged(httpReply->sslConfiguration());
    emit encrypted();
}